

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::OurReader::decodeNumber(OurReader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte *pbVar8;
  ValueHolder local_38;
  undefined2 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  pbVar3 = (byte *)token->end_;
  cVar1 = *token->start_;
  uVar7 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar8 = (byte *)(token->start_ + (cVar1 == '-'));
  if (pbVar8 < pbVar3) {
    uVar5 = uVar7 / 10;
    local_38.int_ = 0;
    do {
      bVar2 = *pbVar8;
      if ((byte)(bVar2 - 0x3a) < 0xf6) {
LAB_00131029:
        bVar4 = decodeDouble(this,token,decoded);
        return bVar4;
      }
      pbVar8 = pbVar8 + 1;
      uVar6 = (ulong)(bVar2 - 0x30);
      if ((uVar5 <= local_38.uint_) &&
         (((uVar5 < local_38.uint_ || (pbVar8 != pbVar3)) || (uVar7 % 10 < uVar6))))
      goto LAB_00131029;
      local_38.string_ = (char *)(uVar6 + local_38.int_ * 10);
    } while (pbVar8 < pbVar3);
    if (cVar1 == '-') {
LAB_00130fef:
      local_38.int_ = -local_38.int_;
    }
    else if (0x7fffffff < local_38.uint_) {
      local_30 = 2;
      goto LAB_00130ffb;
    }
  }
  else {
    local_38.int_ = 0;
    if (cVar1 == '-') goto LAB_00130fef;
  }
  local_30 = 1;
LAB_00130ffb:
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  Value::swap((Value *)&local_38,decoded);
  Value::~Value((Value *)&local_38);
  return true;
}

Assistant:

bool OurReader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of
  // them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}